

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.c
# Opt level: O2

uint aom_highbd_avg_8x8_c(uint8_t *s8,int p)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = (long)s8 * 2;
  iVar1 = 0;
  for (iVar2 = 0; iVar2 != 8; iVar2 = iVar2 + 1) {
    for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
      iVar1 = iVar1 + (uint)*(ushort *)(lVar4 + lVar3 * 2);
    }
    lVar4 = lVar4 + (long)p * 2;
  }
  return iVar1 + 0x20 >> 6;
}

Assistant:

unsigned int aom_highbd_avg_8x8_c(const uint8_t *s8, int p) {
  int i, j;
  int sum = 0;
  const uint16_t *s = CONVERT_TO_SHORTPTR(s8);
  for (i = 0; i < 8; ++i, s += p)
    for (j = 0; j < 8; sum += s[j], ++j) {
    }

  return (sum + 32) >> 6;
}